

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

void cleanup_dun_data(dun_data *dd)

{
  int *p;
  long lVar1;
  int **p_00;
  ulong uVar2;
  
  cave_connectors_free(dun->join);
  cave_connectors_free(dun->one_off_above);
  cave_connectors_free(dun->one_off_below);
  mem_free(dun->cent);
  mem_free(dun->ent_n);
  if (z_info->level_room_max != 0) {
    uVar2 = 0;
    do {
      mem_free(dun->ent[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < z_info->level_room_max);
  }
  mem_free(dun->ent);
  p_00 = dun->ent2room;
  if (p_00 != (int **)0x0) {
    p = *p_00;
    if (p != (int *)0x0) {
      lVar1 = 8;
      do {
        mem_free(p);
        p_00 = dun->ent2room;
        p = *(int **)((long)p_00 + lVar1);
        lVar1 = lVar1 + 8;
      } while (p != (int *)0x0);
    }
    mem_free(p_00);
  }
  mem_free(dun->door);
  mem_free(dun->wall);
  mem_free(dun->tunn);
  return;
}

Assistant:

static void cleanup_dun_data(struct dun_data *dd)
{
	int i;

	cave_connectors_free(dun->join);
	cave_connectors_free(dun->one_off_above);
	cave_connectors_free(dun->one_off_below);
	mem_free(dun->cent);
	mem_free(dun->ent_n);
	for (i = 0; i < z_info->level_room_max; ++i) {
		mem_free(dun->ent[i]);
	}
	mem_free(dun->ent);
	if (dun->ent2room) {
		for (i = 0; dun->ent2room[i]; ++i) {
			mem_free(dun->ent2room[i]);
		}
		mem_free(dun->ent2room);
	}
	mem_free(dun->door);
	mem_free(dun->wall);
	mem_free(dun->tunn);
}